

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_10ddcf::OneLevel::SetUp(OneLevel *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  AssertHelper local_200;
  Message local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_5;
  Message local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  Message local_198;
  ulong local_190;
  ulong local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_3;
  Message local_168;
  ulong local_160;
  ulong local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  ulong local_130;
  ulong local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Message local_108;
  ulong local_100;
  ulong local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  uint mask;
  uint64_t local_b8;
  uint64_t fourth_hash;
  string local_a8;
  uint64_t local_88;
  uint64_t third_hash;
  string local_78;
  uint64_t local_58;
  uint64_t second_hash;
  allocator local_39;
  string local_38;
  uint64_t local_18;
  uint64_t first_hash;
  OneLevel *this_local;
  
  first_hash = (uint64_t)this;
  testing::Test::SetUp((Test *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"a",&local_39);
  uVar2 = hash_function::operator()(&this->hash_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"b",(allocator *)((long)&third_hash + 7));
  uVar2 = hash_function::operator()(&this->hash_,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&third_hash + 7));
  local_58 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"c",(allocator *)((long)&fourth_hash + 7));
  uVar2 = hash_function::operator()(&this->hash_,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fourth_hash + 7));
  local_88 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&mask,"d",
             (allocator *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = hash_function::operator()(&this->hash_,(string *)&mask);
  std::__cxx11::string::~string((string *)&mask);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x3f;
  local_f8 = local_18 & 0x3f;
  local_100 = local_58 & 0x3f;
  local_b8 = uVar2;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_f0,"first_hash & mask","second_hash & mask",&local_f8,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1bd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_128 = local_18 & 0x3f;
  local_130 = local_88 & 0x3f;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_120,"first_hash & mask","third_hash & mask",&local_128,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1be,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_158 = local_18 & 0x3f;
  local_160 = local_b8 & 0x3f;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_150,"first_hash & mask","fourth_hash & mask",&local_158,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1bf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_188 = local_58 & 0x3f;
  local_190 = local_88 & 0x3f;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_180,"second_hash & mask","third_hash & mask",&local_188,&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1c0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1b8 = local_58 & 0x3f;
  local_1c0 = local_b8 & 0x3f;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_1b0,"second_hash & mask","fourth_hash & mask",&local_1b8,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1c1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1e8 = local_88 & 0x3f;
  local_1f0 = local_b8 & 0x3f;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_1e0,"third_hash & mask","fourth_hash & mask",&local_1e8,&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1c2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  return;
}

Assistant:

void SetUp () final {
            GenericIndexFixture::SetUp ();
            // With a known hash function (see map_) and the insertion order below, we should end
            // up with a trie which looks like:
            //
            // root_->bitmap = 0b1000000010001010
            //            +--------+--------+--------+--------+
            // root_ ->   | 000001 | 000011 | 000111 | 001111 |      (hash bits 0-5)
            //            +--------+--------+--------+--------+
            //                |       |          |       |
            //                v       |          |       |
            //               "b"      v          |       |      (0b000001)
            //                       "a"         v       |      (0b000011)
            //                                  "c"      v      (0b000111)
            //                                          "d"     (0b001111)
            std::uint64_t const first_hash = hash_ ("a");
            std::uint64_t const second_hash = hash_ ("b");
            std::uint64_t const third_hash = hash_ ("c");
            std::uint64_t const fourth_hash = hash_ ("d");
            auto const mask = (1U << 6) - 1U;
            EXPECT_NE (first_hash & mask, second_hash & mask);
            EXPECT_NE (first_hash & mask, third_hash & mask);
            EXPECT_NE (first_hash & mask, fourth_hash & mask);
            EXPECT_NE (second_hash & mask, third_hash & mask);
            EXPECT_NE (second_hash & mask, fourth_hash & mask);
            EXPECT_NE (third_hash & mask, fourth_hash & mask);
        }